

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall UtestShellPointerArray::shuffle(UtestShellPointerArray *this,size_t seed)

{
  ulong uVar1;
  int iVar2;
  UtestShellPointerArray *in_RSI;
  UtestShellPointerArray *in_RDI;
  size_t j;
  size_t i;
  size_t local_18;
  
  if (in_RDI->count_ != 0) {
    (*PlatformSpecificSrand)((uint)in_RSI);
    uVar1 = in_RDI->count_;
    while (local_18 = uVar1 - 1, local_18 != 0) {
      if (in_RDI->count_ == 0) {
        return;
      }
      iVar2 = (*PlatformSpecificRand)();
      swap(in_RDI,local_18,(ulong)(long)iVar2 % uVar1);
      uVar1 = local_18;
    }
    relinkTestsInOrder(in_RSI);
  }
  return;
}

Assistant:

void UtestShellPointerArray::shuffle(size_t seed)
{
    if (count_ == 0) return;

    PlatformSpecificSrand((unsigned int) seed);

    for (size_t i = count_ - 1; i >= 1; --i)
    {
        if (count_ == 0) return;

        const size_t j = ((size_t)PlatformSpecificRand()) % (i + 1); // distribution biased by modulo, but good enough for shuffling
        swap(i, j);
   }
   relinkTestsInOrder();
}